

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_type.c
# Opt level: O0

value type_metadata(type_conflict t)

{
  value *ppvVar1;
  value pvVar2;
  value v;
  value *v_array;
  type_conflict in_stack_00000028;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  char *local_8;
  
  local_8 = (char *)value_create_array(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    ppvVar1 = value_to_array((value)0x105c9c);
    pvVar2 = value_create_string(local_8,in_stack_ffffffffffffffd8);
    *ppvVar1 = pvVar2;
    if (*ppvVar1 == (value)0x0) {
      value_type_destroy(in_stack_00000050);
      local_8 = (char *)0x0;
    }
    else {
      pvVar2 = type_metadata_impl(in_stack_00000028);
      ppvVar1[1] = pvVar2;
      if (ppvVar1[1] == (value)0x0) {
        value_type_destroy(in_stack_00000050);
        local_8 = (char *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value type_metadata(type t)
{
	/* The structure of the type is an array (tuple), but it can be used as a pair (key, data) of a map:
	* ["type", {"name":"","id":18}]
	* {"type":{"name":"","id":18}}
	*/

	static const char type_str[] = "type";

	value *v_array, v = value_create_array(NULL, 2);

	if (v == NULL)
	{
		return NULL;
	}

	v_array = value_to_array(v);

	v_array[0] = value_create_string(type_str, sizeof(type_str) - 1);

	if (v_array[0] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	v_array[1] = type_metadata_impl(t);

	if (v_array[1] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	return v;
}